

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (FileDescriptorProto *file_proto,DescriptorPool *alternate_pool,
               FieldDescriptorSet *extensions,string *file_data)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  Descriptor *pDVar4;
  LogMessage *pLVar5;
  Message *pMVar6;
  undefined4 extraout_var;
  LogFinisher local_d9;
  LogMessage local_d8;
  DynamicMessageFactory factory;
  MessageLite *this;
  
  bVar2 = CollectExtensions(&file_proto->super_Message,extensions);
  if (!bVar2) {
    pDVar4 = FileDescriptorProto::GetDescriptor();
    pDVar4 = DescriptorPool::FindMessageTypeByName
                       (alternate_pool,(ConstStringParam)(*(long *)(pDVar4 + 8) + 0x20));
    if (pDVar4 == (Descriptor *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&factory,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x83);
      pLVar5 = internal::LogMessage::operator<<
                         ((LogMessage *)&factory,"CHECK failed: file_proto_desc: ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"Find unknown fields in FileDescriptorProto when building ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,(string *)
                                 ((ulong)(file_proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
      ;
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          ". It\'s likely that those fields are custom options, however, descriptor.proto is not in the transitive dependencies. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)&factory);
    }
    DynamicMessageFactory::DynamicMessageFactory(&factory);
    pMVar6 = DynamicMessageFactory::GetPrototype(&factory,pDVar4);
    iVar3 = (*(pMVar6->super_MessageLite)._vptr_MessageLite[3])(pMVar6,0);
    this = (MessageLite *)CONCAT44(extraout_var,iVar3);
    if (this == (MessageLite *)0x0) {
      internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8c);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: dynamic_file_proto.get() != NULL: ");
      internal::LogFinisher::operator=(&local_d9,pLVar5);
      internal::LogMessage::~LogMessage(&local_d8);
    }
    bVar2 = MessageLite::ParseFromString(this,file_data);
    if (!bVar2) {
      internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8d);
      file_data = (string *)
                  internal::LogMessage::operator<<
                            (&local_d8,
                             "CHECK failed: dynamic_file_proto->ParseFromString(file_data): ");
      internal::LogFinisher::operator=(&local_d9,(LogMessage *)file_data);
      internal::LogMessage::~LogMessage(&local_d8);
    }
    std::
    _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::_M_erase((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)(extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
               (_Link_type)file_data);
    p_Var1 = &(extensions->_M_t)._M_impl.super__Rb_tree_header;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    bVar2 = CollectExtensions((Message *)this,extensions);
    if (!bVar2) {
      internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x93);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: CollectExtensions(*dynamic_file_proto, extensions): ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"Find unknown fields in FileDescriptorProto when building ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,(string *)
                                 ((ulong)(file_proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
      ;
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          ". It\'s likely that those fields are custom options, however, those options cannot be recognized in the builder pool. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=(&local_d9,pLVar5);
      internal::LogMessage::~LogMessage(&local_d8);
    }
    (*this->_vptr_MessageLite[1])(this);
    DynamicMessageFactory::~DynamicMessageFactory(&factory);
  }
  return;
}

Assistant:

void CollectExtensions(const FileDescriptorProto& file_proto,
                       const DescriptorPool& alternate_pool,
                       FieldDescriptorSet* extensions,
                       const std::string& file_data) {
  if (!CollectExtensions(file_proto, extensions)) {
    // There are unknown fields in the file_proto, which are probably
    // extensions. We need to parse the data into a dynamic message based on the
    // builder-pool to find out all extensions.
    const Descriptor* file_proto_desc = alternate_pool.FindMessageTypeByName(
        file_proto.GetDescriptor()->full_name());
    GOOGLE_CHECK(file_proto_desc)
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "descriptor.proto is not in the transitive dependencies. "
           "This normally should not happen. Please report a bug.";
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_file_proto(
        factory.GetPrototype(file_proto_desc)->New());
    GOOGLE_CHECK(dynamic_file_proto.get() != NULL);
    GOOGLE_CHECK(dynamic_file_proto->ParseFromString(file_data));

    // Collect the extensions again from the dynamic message. There should be no
    // more unknown fields this time, i.e. all the custom options should be
    // parsed as extensions now.
    extensions->clear();
    GOOGLE_CHECK(CollectExtensions(*dynamic_file_proto, extensions))
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "those options cannot be recognized in the builder pool. "
           "This normally should not happen. Please report a bug.";
  }
}